

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * getaddednodeinfo(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff1c8;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1d0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff200;
  allocator<char> *in_stack_fffffffffffff208;
  iterator in_stack_fffffffffffff210;
  RPCArgOptions *in_stack_fffffffffffff218;
  string *in_stack_fffffffffffff220;
  undefined7 in_stack_fffffffffffff228;
  undefined1 in_stack_fffffffffffff22f;
  undefined4 in_stack_fffffffffffff230;
  Type in_stack_fffffffffffff234;
  string *in_stack_fffffffffffff238;
  RPCArg *in_stack_fffffffffffff240;
  undefined4 in_stack_fffffffffffff248;
  Type in_stack_fffffffffffff24c;
  RPCResult *in_stack_fffffffffffff250;
  undefined1 *local_d50;
  undefined1 *local_d38;
  undefined1 *local_d20;
  undefined1 *local_d08;
  RPCExamples *in_stack_fffffffffffff310;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_b00 [32];
  undefined1 local_ae0;
  undefined1 local_adf;
  undefined1 local_ade;
  undefined1 local_add [36];
  allocator<char> local_ab9 [31];
  allocator<char> local_a9a;
  allocator<char> local_a99 [31];
  allocator<char> local_a7a;
  allocator<char> local_a79 [31];
  allocator<char> local_a5a;
  allocator<char> local_a59;
  size_type local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a50;
  allocator<char> local_a3a;
  allocator<char> local_a39 [9];
  size_type sStack_a30;
  undefined1 local_a28 [15];
  allocator<char> local_a19 [31];
  allocator<char> local_9fa;
  allocator<char> local_9f9 [31];
  allocator<char> local_9da;
  allocator<char> local_9d9 [30];
  allocator<char> local_9bb;
  allocator<char> local_9ba;
  undefined1 local_9b9 [32];
  allocator<char> local_999 [385];
  undefined1 local_818 [272];
  undefined1 local_708 [64];
  undefined1 local_6c8 [136];
  undefined1 local_640 [192];
  undefined1 local_580 [408];
  undefined1 local_3e8 [64];
  undefined1 local_3a8 [136];
  undefined1 local_320 [200];
  undefined1 local_258;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined1 local_217;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  fun = (RPCMethodImpl *)local_9b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  local_258 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff1e0);
  local_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff1c8);
  local_218 = 0;
  local_217 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff240,in_stack_fffffffffffff238,in_stack_fffffffffffff234,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                 in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff1c8);
  __l._M_len = (size_type)in_stack_fffffffffffff218;
  __l._M_array = in_stack_fffffffffffff210;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff208,__l,
             (allocator_type *)in_stack_fffffffffffff200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  local_a39[1] = (allocator<char>)0x0;
  local_a39[2] = (allocator<char>)0x0;
  local_a39[3] = (allocator<char>)0x0;
  local_a39[4] = (allocator<char>)0x0;
  local_a39[5] = (allocator<char>)0x0;
  local_a39[6] = (allocator<char>)0x0;
  local_a39[7] = (allocator<char>)0x0;
  local_a39[8] = (allocator<char>)0x0;
  sStack_a30 = 0;
  local_a28._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  local_a58 = 0;
  aStack_a50._M_allocated_capacity = 0;
  aStack_a50._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  local_ab9[1] = (allocator<char>)0x0;
  local_ab9[2] = (allocator<char>)0x0;
  local_ab9[3] = (allocator<char>)0x0;
  local_ab9[4] = (allocator<char>)0x0;
  local_ab9[5] = (allocator<char>)0x0;
  local_ab9[6] = (allocator<char>)0x0;
  local_ab9[7] = (allocator<char>)0x0;
  local_ab9[8] = (allocator<char>)0x0;
  local_ab9._9_8_ = 0;
  local_ab9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  local_add._5_8_ = (pointer)0x0;
  local_add._13_8_ = (pointer)0x0;
  local_add._21_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff1c8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff218;
  __l_00._M_array = (iterator)in_stack_fffffffffffff210;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208,__l_00,
             (allocator_type *)in_stack_fffffffffffff200);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff1c8);
  __l_01._M_len = (size_type)in_stack_fffffffffffff218;
  __l_01._M_array = (iterator)in_stack_fffffffffffff210;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208,__l_01,
             (allocator_type *)in_stack_fffffffffffff200);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff1c8);
  __l_02._M_len = (size_type)in_stack_fffffffffffff218;
  __l_02._M_array = (iterator)in_stack_fffffffffffff210;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208,__l_02,
             (allocator_type *)in_stack_fffffffffffff200);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff1c8);
  __l_03._M_len = (size_type)in_stack_fffffffffffff218;
  __l_03._M_array = (iterator)in_stack_fffffffffffff210;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208,__l_03,
             (allocator_type *)in_stack_fffffffffffff200);
  RPCResult::RPCResult
            (in_stack_fffffffffffff250,in_stack_fffffffffffff24c,&in_stack_fffffffffffff240->m_names
             ,in_stack_fffffffffffff238,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (bool)in_stack_fffffffffffff22f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
             (RPCResult *)in_stack_fffffffffffff240);
  this_00 = (RPCHelpMan *)local_add;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  name = (string *)&local_ade;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  HelpExampleCli(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  description = (string *)&local_adf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_ae0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff218,(char *)in_stack_fffffffffffff210,in_stack_fffffffffffff208);
  HelpExampleRpc(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  std::operator+(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff1c8,(string *)0x644781);
  this = (RPCArg *)local_b00;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getaddednodeinfo()::__0,void>
            (in_stack_fffffffffffff1d8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff1d0);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_fffffffffffff310,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_adf);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_ade);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_add);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar1 = local_320;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != local_3a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d08 = local_3e8;
  do {
    local_d08 = local_d08 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_d08 != local_580);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d20 = local_640;
  do {
    local_d20 = local_d20 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_d20 != local_6c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d38 = local_708;
  do {
    local_d38 = local_d38 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_d38 != local_818);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_add + 0x23));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ab9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a99);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_a28 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a19);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9d9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d50 = local_48;
  do {
    local_d50 = local_d50 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d50 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9bb);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_9b9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_9b9 + 0x1f));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_999);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getaddednodeinfo()
{
    return RPCHelpMan{"getaddednodeinfo",
                "\nReturns information about the given added node, or all added nodes\n"
                "(note that onetry addnodes are not listed here)\n",
                {
                    {"node", RPCArg::Type::STR, RPCArg::DefaultHint{"all nodes"}, "If provided, return information about this specific node, otherwise all nodes are returned."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR, "addednode", "The node IP address or name (as provided to addnode)"},
                            {RPCResult::Type::BOOL, "connected", "If connected"},
                            {RPCResult::Type::ARR, "addresses", "Only when connected = true",
                            {
                                {RPCResult::Type::OBJ, "", "",
                                {
                                    {RPCResult::Type::STR, "address", "The bitcoin server IP and port we're connected to"},
                                    {RPCResult::Type::STR, "connected", "connection, inbound or outbound"},
                                }},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddednodeinfo", "\"192.168.0.201\"")
            + HelpExampleRpc("getaddednodeinfo", "\"192.168.0.201\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    std::vector<AddedNodeInfo> vInfo = connman.GetAddedNodeInfo(/*include_connected=*/true);

    if (!request.params[0].isNull()) {
        bool found = false;
        for (const AddedNodeInfo& info : vInfo) {
            if (info.m_params.m_added_node == request.params[0].get_str()) {
                vInfo.assign(1, info);
                found = true;
                break;
            }
        }
        if (!found) {
            throw JSONRPCError(RPC_CLIENT_NODE_NOT_ADDED, "Error: Node has not been added.");
        }
    }

    UniValue ret(UniValue::VARR);

    for (const AddedNodeInfo& info : vInfo) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("addednode", info.m_params.m_added_node);
        obj.pushKV("connected", info.fConnected);
        UniValue addresses(UniValue::VARR);
        if (info.fConnected) {
            UniValue address(UniValue::VOBJ);
            address.pushKV("address", info.resolvedAddress.ToStringAddrPort());
            address.pushKV("connected", info.fInbound ? "inbound" : "outbound");
            addresses.push_back(std::move(address));
        }
        obj.pushKV("addresses", std::move(addresses));
        ret.push_back(std::move(obj));
    }

    return ret;
},
    };
}